

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void cm_expat_XML_DefaultCurrent(XML_Parser parser)

{
  XML_Parser parser_local;
  
  if (*(long *)((long)parser + 0xa0) != 0) {
    if (*(long *)((long)parser + 0x230) == 0) {
      reportDefault(parser,*(ENCODING **)((long)parser + 0x118),*(char **)((long)parser + 0x218),
                    *(char **)((long)parser + 0x220));
    }
    else {
      reportDefault(parser,*(ENCODING **)((long)parser + 0x1b8),
                    (char *)**(undefined8 **)((long)parser + 0x230),
                    *(char **)(*(long *)((long)parser + 0x230) + 8));
    }
  }
  return;
}

Assistant:

void XML_DefaultCurrent(XML_Parser parser)
{
  if (defaultHandler) {
    if (openInternalEntities)
      reportDefault(parser,
                    internalEncoding,
                    openInternalEntities->internalEventPtr,
                    openInternalEntities->internalEventEndPtr);
    else
      reportDefault(parser, encoding, eventPtr, eventEndPtr);
  }
}